

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O2

int Map_SuperTableInsert(Map_HashTable_t *p,uint *uTruth,Map_Super_t *pGate,uint uPhase)

{
  ulong uVar1;
  Map_HashEntry_t *pMVar2;
  Map_HashEntry_t **ppMVar3;
  uint uVar4;
  
  uVar4 = p->nBins;
  if ((int)(uVar4 * 2) <= p->nEntries) {
    Map_SuperTableResize(p);
    uVar4 = p->nBins;
  }
  uVar1 = (ulong)(uTruth[1] * 0x7d3 + *uTruth) % (ulong)uVar4;
  ppMVar3 = p->pBins + uVar1;
  while( true ) {
    pMVar2 = *ppMVar3;
    if (pMVar2 == (Map_HashEntry_t *)0x0) {
      pMVar2 = (Map_HashEntry_t *)Extra_MmFixedEntryFetch(p->mmMan);
      pMVar2->uTruth[0] = 0;
      pMVar2->uTruth[1] = 0;
      *(undefined8 *)&pMVar2->uPhase = 0;
      pMVar2->pGates = (Map_Super_t *)0x0;
      pMVar2->pNext = (Map_HashEntry_t *)0x0;
      pMVar2->uTruth[0] = *uTruth;
      pMVar2->uTruth[1] = uTruth[1];
      pMVar2->pGates = pGate;
      pMVar2->uPhase = uPhase;
      ppMVar3 = p->pBins;
      pMVar2->pNext = ppMVar3[uVar1];
      ppMVar3[uVar1] = pMVar2;
      p->nEntries = p->nEntries + 1;
      return 0;
    }
    if ((pMVar2->uTruth[0] == *uTruth) && (pMVar2->uTruth[1] == uTruth[1])) break;
    ppMVar3 = &pMVar2->pNext;
  }
  return 1;
}

Assistant:

int Map_SuperTableInsert( Map_HashTable_t * p, unsigned uTruth[], Map_Super_t * pGate, unsigned uPhase )
{
    Map_HashEntry_t * pEnt;
    unsigned Key;
    // resize the table
    if ( p->nEntries >= 2 * p->nBins )
        Map_SuperTableResize( p );
    // check if this entry already exists
    Key = MAP_TABLE_HASH( uTruth[0], uTruth[1], p->nBins );
    for ( pEnt = p->pBins[Key]; pEnt; pEnt = pEnt->pNext )
        if ( pEnt->uTruth[0] == uTruth[0] && pEnt->uTruth[1] == uTruth[1] )
            return 1;
    // add the new hash table entry to the table
    pEnt = (Map_HashEntry_t *)Extra_MmFixedEntryFetch( p->mmMan );
    memset( pEnt, 0, sizeof(Map_HashEntry_t) );
    pEnt->uTruth[0] = uTruth[0];
    pEnt->uTruth[1] = uTruth[1];
    pEnt->pGates    = pGate;
    pEnt->uPhase    = uPhase;
    // add the hash table to the corresponding linked list in the table
    pEnt->pNext   = p->pBins[Key];
    p->pBins[Key] = pEnt;
    p->nEntries++;
/*
printf( "Adding gate: %10u ", Key );
Map_LibraryPrintSupergate( pGate );
Extra_PrintBinary( stdout, uTruth, 32 );
printf( "\n" );
*/
    return 0;
}